

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O2

void __thiscall adios2::aggregator::MPIShmChain::Close(MPIShmChain *this)

{
  allocator local_29;
  string local_28;
  
  if ((this->super_MPIAggregator).m_IsActive == true) {
    std::__cxx11::string::string
              ((string *)&local_28,"free per-node comm in ~MPIShmChain()",&local_29);
    helper::Comm::Free(&this->m_NodeComm,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string
              ((string *)&local_28,"free chain of nodes in ~MPIShmChain()",&local_29);
    helper::Comm::Free(&this->m_OnePerNodeComm,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string
              ((string *)&local_28,"free comm of all aggregators in ~MPIShmChain()",&local_29);
    helper::Comm::Free(&this->m_AllAggregatorsComm,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::string
              ((string *)&local_28,"free chains of aggregators in ~MPIShmChain()",&local_29);
    helper::Comm::Free(&this->m_AggregatorChainComm,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  MPIAggregator::Close(&this->super_MPIAggregator);
  return;
}

Assistant:

void MPIShmChain::Close()
{
    if (m_IsActive)
    {
        m_NodeComm.Free("free per-node comm in ~MPIShmChain()");
        m_OnePerNodeComm.Free("free chain of nodes in ~MPIShmChain()");
        m_AllAggregatorsComm.Free("free comm of all aggregators in ~MPIShmChain()");
        m_AggregatorChainComm.Free("free chains of aggregators in ~MPIShmChain()");
    }
    MPIAggregator::Close();
}